

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

void __thiscall
spirv_cross::SmallVector<spirv_cross::BuiltInResource,_8UL>::clear
          (SmallVector<spirv_cross::BuiltInResource,_8UL> *this)

{
  BuiltInResource *pBVar1;
  void *pvVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  uVar3 = (this->super_VectorView<spirv_cross::BuiltInResource>).buffer_size;
  if (uVar3 != 0) {
    lVar4 = 0x28;
    uVar5 = 0;
    do {
      pBVar1 = (this->super_VectorView<spirv_cross::BuiltInResource>).ptr;
      pvVar2 = *(void **)((long)pBVar1 + lVar4 + -0x10);
      if ((void *)((long)&pBVar1->builtin + lVar4) != pvVar2) {
        operator_delete(pvVar2);
        uVar3 = (this->super_VectorView<spirv_cross::BuiltInResource>).buffer_size;
      }
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x38;
    } while (uVar5 < uVar3);
  }
  (this->super_VectorView<spirv_cross::BuiltInResource>).buffer_size = 0;
  return;
}

Assistant:

void clear() SPIRV_CROSS_NOEXCEPT
	{
		for (size_t i = 0; i < this->buffer_size; i++)
			this->ptr[i].~T();
		this->buffer_size = 0;
	}